

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

portnode_t * P_DelPortalnode(portnode_t *node)

{
  portnode_t *ppVar1;
  portnode_t *ppVar2;
  portnode_t *sn;
  portnode_t *sp;
  portnode_t *tn;
  portnode_t *tp;
  portnode_t *node_local;
  
  if (node == (portnode_t *)0x0) {
    node_local = (portnode_t *)0x0;
  }
  else {
    ppVar1 = node->m_tprev;
    node_local = node->m_tnext;
    if (ppVar1 != (portnode_t *)0x0) {
      ppVar1->m_tnext = node_local;
    }
    if (node_local != (portnode_t *)0x0) {
      node_local->m_tprev = ppVar1;
    }
    ppVar1 = node->m_sprev;
    ppVar2 = node->m_snext;
    if (ppVar1 == (portnode_t *)0x0) {
      node->m_portal->render_thinglist = ppVar2;
    }
    else {
      ppVar1->m_snext = ppVar2;
    }
    if (ppVar2 != (portnode_t *)0x0) {
      ppVar2->m_sprev = ppVar1;
    }
    P_PutSecnode((msecnode_t *)node);
  }
  return node_local;
}

Assistant:

portnode_t *P_DelPortalnode(portnode_t *node)
{
	portnode_t* tp;  // prev node on thing thread
	portnode_t* tn;  // next node on thing thread
	portnode_t* sp;  // prev node on sector thread
	portnode_t* sn;  // next node on sector thread

	if (node)
	{
		// Unlink from the Thing thread. The Thing thread begins at
		// sector_list and not from AActor->touching_sectorlist.

		tp = node->m_tprev;
		tn = node->m_tnext;
		if (tp)
			tp->m_tnext = tn;
		if (tn)
			tn->m_tprev = tp;

		// Unlink from the sector thread. This thread begins at
		// sector_t->touching_thinglist.

		sp = node->m_sprev;
		sn = node->m_snext;
		if (sp)
			sp->m_snext = sn;
		else
			node->m_portal->render_thinglist = sn;
		if (sn)
			sn->m_sprev = sp;

		// Return this node to the freelist (use the same one as for msecnodes, since both types are the same size.)
		P_PutSecnode(reinterpret_cast<msecnode_t *>(node));
		return tn;
	}
	return NULL;
}